

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

string_view __thiscall slang::parsing::Trivia::getRawText(Trivia *this)

{
  string_view sVar1;
  long *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffff0;
  char *local_8;
  
  if ((byte)(*(char *)((long)in_RDI + 0xd) - 6U) < 3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)in_RDI);
  }
  else if ((*(byte *)((long)in_RDI + 0xc) & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0,
               (char *)*in_RDI,(ulong)*(uint *)(in_RDI + 1));
  }
  else {
    in_stack_fffffffffffffff0 = *(basic_string_view<char,_std::char_traits<char>_> **)*in_RDI;
    local_8 = (char *)((size_t *)*in_RDI)[1];
  }
  sVar1._M_str = local_8;
  sVar1._M_len = (size_t)in_stack_fffffffffffffff0;
  return sVar1;
}

Assistant:

std::string_view Trivia::getRawText() const {
    switch (kind) {
        case TriviaKind::Directive:
        case TriviaKind::SkippedSyntax:
        case TriviaKind::SkippedTokens:
            return "";
        default:
            if (hasFullLocation)
                return fullLocation->text;
            return {rawText.ptr, rawText.len};
    }
}